

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setPragmaResultColumnNames(Vdbe *v,PragmaName *pPragma)

{
  byte bVar1;
  uint local_34;
  uint local_24;
  int local_20;
  int j;
  int i;
  u8 n;
  PragmaName *pPragma_local;
  Vdbe *v_local;
  
  bVar1 = pPragma->nPragCName;
  if (bVar1 == 0) {
    local_34 = 1;
  }
  else {
    local_34 = (uint)bVar1;
  }
  sqlite3VdbeSetNumCols(v,local_34);
  if (bVar1 == 0) {
    sqlite3VdbeSetColName(v,0,0,pPragma->zName,(_func_void_void_ptr *)0x0);
  }
  else {
    local_20 = 0;
    local_24 = (uint)pPragma->iPragCName;
    for (; local_20 < (int)(uint)bVar1; local_20 = local_20 + 1) {
      sqlite3VdbeSetColName(v,local_20,0,pragCName[(int)local_24],(_func_void_void_ptr *)0x0);
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

static void setPragmaResultColumnNames(
  Vdbe *v,                     /* The query under construction */
  const PragmaName *pPragma    /* The pragma */
){
  u8 n = pPragma->nPragCName;
  sqlite3VdbeSetNumCols(v, n==0 ? 1 : n);
  if( n==0 ){
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, pPragma->zName, SQLITE_STATIC);
  }else{
    int i, j;
    for(i=0, j=pPragma->iPragCName; i<n; i++, j++){
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, pragCName[j], SQLITE_STATIC);
    }
  }
}